

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O0

void __thiscall
MPLSStreamInfo::composeStreamEntry
          (MPLSStreamInfo *this,BitStreamWriter *writer,size_t entryNum,int subPathID)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint8_t *puVar4;
  VodCoreException *this_00;
  string local_1e0;
  ostringstream local_1b0 [8];
  ostringstream ss;
  int initPos;
  uint8_t *lengthPos;
  int subPathID_local;
  size_t entryNum_local;
  BitStreamWriter *writer_local;
  MPLSStreamInfo *this_local;
  
  puVar4 = BitStream::getBuffer(&writer->super_BitStream);
  iVar1 = BitStreamWriter::getBitsCount(writer);
  BitStreamWriter::putBits(writer,8,0);
  iVar2 = BitStreamWriter::getBitsCount(writer);
  BitStreamWriter::putBits(writer,8,(uint)this->type);
  if (this->type == '\x01') {
    BitStreamWriter::putBits(writer,0x10,(this->super_M2TSStreamInfo).streamPID);
    BitStreamWriter::putBits(writer,0x20,0);
    BitStreamWriter::putBits(writer,0x10,0);
  }
  else if (this->type == '\x02') {
    BitStreamWriter::putBits(writer,8,0);
    BitStreamWriter::putBits(writer,8,0);
    BitStreamWriter::putBits(writer,0x10,(this->super_M2TSStreamInfo).streamPID);
    BitStreamWriter::putBits(writer,0x20,0);
  }
  else if (this->type == '\x03') {
    BitStreamWriter::putBits(writer,8,subPathID);
    BitStreamWriter::putBits(writer,0x10,(this->super_M2TSStreamInfo).streamPID);
    BitStreamWriter::putBits(writer,0x20,0);
    BitStreamWriter::putBits(writer,8,0);
  }
  else {
    if (this->type != '\x04') {
      std::__cxx11::ostringstream::ostringstream(local_1b0);
      std::operator<<((ostream *)local_1b0,"Unsupported media type for AVCHD/Blu-ray muxing");
      this_00 = (VodCoreException *)__cxa_allocate_exception(0x28);
      std::__cxx11::ostringstream::str();
      VodCoreException::VodCoreException(this_00,3,&local_1e0);
      __cxa_throw(this_00,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
    }
    BitStreamWriter::putBits(writer,8,0);
    BitStreamWriter::putBits(writer,0x10,(this->super_M2TSStreamInfo).streamPID);
    BitStreamWriter::putBits(writer,0x20,0);
    BitStreamWriter::putBits(writer,8,0);
  }
  iVar3 = BitStreamWriter::getBitsCount(writer);
  puVar4[iVar1 / 8] = (char)(iVar3 / 8) - (char)(iVar2 / 8);
  return;
}

Assistant:

void MPLSStreamInfo::composeStreamEntry(BitStreamWriter& writer, size_t entryNum, const int subPathID) const
{
    uint8_t* lengthPos = writer.getBuffer() + writer.getBitsCount() / 8;
    writer.putBits(8, 0);  // length
    const int initPos = writer.getBitsCount() / 8;
    writer.putBits(8, type);
    if (type == 1)
    {
        writer.putBits(16, streamPID);
        writer.putBits(32, 0);
        writer.putBits(16, 0);
    }
    else if (type == 2)
    {
        writer.putBits(8, 0);  // ref_to_SubPath_id
        writer.putBits(8, 0);  // entryNum - ref_to_subClip_entry_id
        writer.putBits(16, streamPID);
        writer.putBits(32, 0);
    }
    else if (type == 3)
    {
        writer.putBits(8, subPathID);  // ref_to_SubPath_id. constant subPathID == 0
        writer.putBits(16, streamPID);
        writer.putBits(32, 0);
        writer.putBits(8, 0);
    }
    else if (type == 4)
    {
        writer.putBits(8, 0);
        writer.putBits(16, streamPID);
        writer.putBits(32, 0);
        writer.putBits(8, 0);
    }
    else
        THROW(ERR_COMMON, "Unsupported media type for AVCHD/Blu-ray muxing")
    *lengthPos = static_cast<uint8_t>(writer.getBitsCount() / 8 - initPos);
}